

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCellWriteLocalPayload
              (lhcell *pCell,void *pKey,sxu32 nKeylen,void *pData,unqlite_int64 nDatalen)

{
  sxu32 sVar1;
  uchar *pDest;
  
  pDest = pCell->pPage->pRaw->zData + (ulong)pCell->iStart + 0x1a;
  sVar1 = SyMemcpy(pKey,pDest,nKeylen);
  if (0 < nDatalen) {
    sVar1 = SyMemcpy(pData,pDest + nKeylen,(sxu32)nDatalen);
    return sVar1;
  }
  return sVar1;
}

Assistant:

static int lhCellWriteLocalPayload(lhcell *pCell,
	const void *pKey,sxu32 nKeylen,
	const void *pData,unqlite_int64 nDatalen
	)
{
	/* A writer lock have been acquired on this page */
	lhpage *pPage = pCell->pPage;
	unsigned char *zRaw = pPage->pRaw->zData;
	/* Seek to the desired location */
	zRaw += pCell->iStart + L_HASH_CELL_SZ;
	/* Write the key */
	SyMemcpy(pKey,(void *)zRaw,nKeylen);
	zRaw += nKeylen;
	if( nDatalen > 0 ){
		/* Write the Data */
		SyMemcpy(pData,(void *)zRaw,(sxu32)nDatalen);
	}
	return UNQLITE_OK;
}